

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void clearAllObjects(void)

{
  shared_ptr<MasterObjectHolder> holder;
  MasterObjectHolder *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  getMasterHolder();
  if (local_18 != (MasterObjectHolder *)0x0) {
    MasterObjectHolder::deleteAll(local_18);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return;
}

Assistant:

void clearAllObjects()
{
    auto holder = getMasterHolder();
    if (holder) {
        holder->deleteAll();
    }
}